

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ir_context.h
# Opt level: O1

void __thiscall
spvtools::opt::IRContext::CloneNames
          (IRContext *this,uint32_t old_id,uint32_t new_id,uint32_t max_member_index)

{
  _Rb_tree_header *p_Var1;
  Module *pMVar2;
  _Rb_tree<unsigned_int,std::pair<unsigned_int_const,spvtools::opt::Instruction*>,std::_Select1st<std::pair<unsigned_int_const,spvtools::opt::Instruction*>>,std::less<unsigned_int>,std::allocator<std::pair<unsigned_int_const,spvtools::opt::Instruction*>>>
  *p_Var3;
  pointer pOVar4;
  pointer puVar5;
  uint32_t uVar6;
  pointer __p;
  ulong uVar7;
  _Rb_tree_iterator<std::pair<const_unsigned_int,_spvtools::opt::Instruction_*>_> _Var8;
  ulong uVar9;
  uint uVar10;
  Instruction *debug_inst;
  Instruction *pIVar11;
  pointer puVar12;
  pair<std::_Rb_tree_iterator<std::pair<const_unsigned_int,_spvtools::opt::Instruction_*>_>,_std::_Rb_tree_iterator<std::pair<const_unsigned_int,_spvtools::opt::Instruction_*>_>_>
  pVar13;
  unique_ptr<spvtools::opt::Instruction,_std::default_delete<spvtools::opt::Instruction>_>
  new_name_inst;
  vector<std::unique_ptr<spvtools::opt::Instruction,_std::default_delete<spvtools::opt::Instruction>_>,_std::allocator<std::unique_ptr<spvtools::opt::Instruction,_std::default_delete<spvtools::opt::Instruction>_>_>_>
  names_to_add;
  _Head_base<0UL,_spvtools::opt::Instruction_*,_false> local_80;
  uint32_t local_74;
  undefined1 local_70 [32];
  _Head_base<0UL,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*,_false> local_50;
  vector<std::unique_ptr<spvtools::opt::Instruction,_std::default_delete<spvtools::opt::Instruction>_>,_std::allocator<std::unique_ptr<spvtools::opt::Instruction,_std::default_delete<spvtools::opt::Instruction>_>_>_>
  local_48;
  
  local_48.
  super__Vector_base<std::unique_ptr<spvtools::opt::Instruction,_std::default_delete<spvtools::opt::Instruction>_>,_std::allocator<std::unique_ptr<spvtools::opt::Instruction,_std::default_delete<spvtools::opt::Instruction>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_48.
  super__Vector_base<std::unique_ptr<spvtools::opt::Instruction,_std::default_delete<spvtools::opt::Instruction>_>,_std::allocator<std::unique_ptr<spvtools::opt::Instruction,_std::default_delete<spvtools::opt::Instruction>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_48.
  super__Vector_base<std::unique_ptr<spvtools::opt::Instruction,_std::default_delete<spvtools::opt::Instruction>_>,_std::allocator<std::unique_ptr<spvtools::opt::Instruction,_std::default_delete<spvtools::opt::Instruction>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_80._M_head_impl._0_4_ = old_id;
  local_74 = max_member_index;
  if ((this->valid_analyses_ & kAnalysisNameMap) == kAnalysisNone) {
    __p = (pointer)operator_new(0x30);
    p_Var1 = &(__p->_M_t)._M_impl.super__Rb_tree_header;
    (__p->_M_t)._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
    (__p->_M_t)._M_impl.super__Rb_tree_header._M_header._M_left = (_Base_ptr)0x0;
    (__p->_M_t)._M_impl.super__Rb_tree_header._M_header._M_right = (_Base_ptr)0x0;
    (__p->_M_t)._M_impl.super__Rb_tree_header._M_node_count = 0;
    *(undefined8 *)&(__p->_M_t)._M_impl = 0;
    *(undefined8 *)&(__p->_M_t)._M_impl.super__Rb_tree_header._M_header = 0;
    (__p->_M_t)._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var1->_M_header;
    (__p->_M_t)._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var1->_M_header;
    (__p->_M_t)._M_impl.super__Rb_tree_header._M_node_count = 0;
    std::
    __uniq_ptr_impl<std::multimap<unsigned_int,_spvtools::opt::Instruction_*,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_spvtools::opt::Instruction_*>_>_>,_std::default_delete<std::multimap<unsigned_int,_spvtools::opt::Instruction_*,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_spvtools::opt::Instruction_*>_>_>_>_>
    ::reset((__uniq_ptr_impl<std::multimap<unsigned_int,_spvtools::opt::Instruction_*,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_spvtools::opt::Instruction_*>_>_>,_std::default_delete<std::multimap<unsigned_int,_spvtools::opt::Instruction_*,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_spvtools::opt::Instruction_*>_>_>_>_>
             *)&this->id_to_name_,__p);
    pMVar2 = (this->module_)._M_t.
             super___uniq_ptr_impl<spvtools::opt::Module,_std::default_delete<spvtools::opt::Module>_>
             ._M_t.
             super__Tuple_impl<0UL,_spvtools::opt::Module_*,_std::default_delete<spvtools::opt::Module>_>
             .super__Head_base<0UL,_spvtools::opt::Module_*,_false>._M_head_impl;
    for (pIVar11 = (pMVar2->debugs2_).super_IntrusiveList<spvtools::opt::Instruction>.sentinel_.
                   super_IntrusiveNodeBase<spvtools::opt::Instruction>.next_node_;
        pIVar11 != &(pMVar2->debugs2_).super_IntrusiveList<spvtools::opt::Instruction>.sentinel_;
        pIVar11 = (pIVar11->super_IntrusiveNodeBase<spvtools::opt::Instruction>).next_node_) {
      if (pIVar11->opcode_ - OpName < 2) {
        p_Var3 = (_Rb_tree<unsigned_int,std::pair<unsigned_int_const,spvtools::opt::Instruction*>,std::_Select1st<std::pair<unsigned_int_const,spvtools::opt::Instruction*>>,std::less<unsigned_int>,std::allocator<std::pair<unsigned_int_const,spvtools::opt::Instruction*>>>
                  *)(this->id_to_name_)._M_t.
                    super___uniq_ptr_impl<std::multimap<unsigned_int,_spvtools::opt::Instruction_*,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_spvtools::opt::Instruction_*>_>_>,_std::default_delete<std::multimap<unsigned_int,_spvtools::opt::Instruction_*,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_spvtools::opt::Instruction_*>_>_>_>_>
                    ._M_t.
                    super__Tuple_impl<0UL,_std::multimap<unsigned_int,_spvtools::opt::Instruction_*,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_spvtools::opt::Instruction_*>_>_>_*,_std::default_delete<std::multimap<unsigned_int,_spvtools::opt::Instruction_*,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_spvtools::opt::Instruction_*>_>_>_>_>
                    .
                    super__Head_base<0UL,_std::multimap<unsigned_int,_spvtools::opt::Instruction_*,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_spvtools::opt::Instruction_*>_>_>_*,_false>
                    ._M_head_impl;
        uVar6 = (pIVar11->has_result_id_ & 1) + 1;
        if (pIVar11->has_type_id_ == false) {
          uVar6 = (uint)pIVar11->has_result_id_;
        }
        uVar6 = Instruction::GetSingleWordOperand(pIVar11,uVar6);
        local_70._0_4_ = uVar6;
        local_70._8_8_ = pIVar11;
        std::
        _Rb_tree<unsigned_int,std::pair<unsigned_int_const,spvtools::opt::Instruction*>,std::_Select1st<std::pair<unsigned_int_const,spvtools::opt::Instruction*>>,std::less<unsigned_int>,std::allocator<std::pair<unsigned_int_const,spvtools::opt::Instruction*>>>
        ::_M_insert_equal<std::pair<unsigned_int_const,spvtools::opt::Instruction*>>
                  (p_Var3,(pair<const_unsigned_int,_spvtools::opt::Instruction_*> *)local_70);
      }
    }
    *(undefined1 *)&this->valid_analyses_ = (char)this->valid_analyses_ | kAnalysisNameMap;
  }
  pVar13 = std::
           _Rb_tree<unsigned_int,_std::pair<const_unsigned_int,_spvtools::opt::Instruction_*>,_std::_Select1st<std::pair<const_unsigned_int,_spvtools::opt::Instruction_*>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_spvtools::opt::Instruction_*>_>_>
           ::equal_range(&((this->id_to_name_)._M_t.
                           super___uniq_ptr_impl<std::multimap<unsigned_int,_spvtools::opt::Instruction_*,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_spvtools::opt::Instruction_*>_>_>,_std::default_delete<std::multimap<unsigned_int,_spvtools::opt::Instruction_*,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_spvtools::opt::Instruction_*>_>_>_>_>
                           ._M_t.
                           super__Tuple_impl<0UL,_std::multimap<unsigned_int,_spvtools::opt::Instruction_*,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_spvtools::opt::Instruction_*>_>_>_*,_std::default_delete<std::multimap<unsigned_int,_spvtools::opt::Instruction_*,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_spvtools::opt::Instruction_*>_>_>_>_>
                           .
                           super__Head_base<0UL,_std::multimap<unsigned_int,_spvtools::opt::Instruction_*,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_spvtools::opt::Instruction_*>_>_>_*,_false>
                          ._M_head_impl)->_M_t,(key_type *)&local_80);
  _Var8 = pVar13.first._M_node;
  puVar12 = local_48.
            super__Vector_base<std::unique_ptr<spvtools::opt::Instruction,_std::default_delete<spvtools::opt::Instruction>_>,_std::allocator<std::unique_ptr<spvtools::opt::Instruction,_std::default_delete<spvtools::opt::Instruction>_>_>_>
            ._M_impl.super__Vector_impl_data._M_start;
  puVar5 = local_48.
           super__Vector_base<std::unique_ptr<spvtools::opt::Instruction,_std::default_delete<spvtools::opt::Instruction>_>,_std::allocator<std::unique_ptr<spvtools::opt::Instruction,_std::default_delete<spvtools::opt::Instruction>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  do {
    local_48.
    super__Vector_base<std::unique_ptr<spvtools::opt::Instruction,_std::default_delete<spvtools::opt::Instruction>_>,_std::allocator<std::unique_ptr<spvtools::opt::Instruction,_std::default_delete<spvtools::opt::Instruction>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start = puVar12;
    local_48.
    super__Vector_base<std::unique_ptr<spvtools::opt::Instruction,_std::default_delete<spvtools::opt::Instruction>_>,_std::allocator<std::unique_ptr<spvtools::opt::Instruction,_std::default_delete<spvtools::opt::Instruction>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = puVar5;
    if (_Var8._M_node == pVar13.second._M_node._M_node) {
      if (puVar12 != puVar5) {
        do {
          if (((this->valid_analyses_ & kAnalysisNameMap) != kAnalysisNone) &&
             (pIVar11 = (puVar12->_M_t).
                        super___uniq_ptr_impl<spvtools::opt::Instruction,_std::default_delete<spvtools::opt::Instruction>_>
                        ._M_t.
                        super__Tuple_impl<0UL,_spvtools::opt::Instruction_*,_std::default_delete<spvtools::opt::Instruction>_>
                        .super__Head_base<0UL,_spvtools::opt::Instruction_*,_false>._M_head_impl,
             pIVar11->opcode_ - OpName < 2)) {
            p_Var3 = (_Rb_tree<unsigned_int,std::pair<unsigned_int_const,spvtools::opt::Instruction*>,std::_Select1st<std::pair<unsigned_int_const,spvtools::opt::Instruction*>>,std::less<unsigned_int>,std::allocator<std::pair<unsigned_int_const,spvtools::opt::Instruction*>>>
                      *)(this->id_to_name_)._M_t.
                        super___uniq_ptr_impl<std::multimap<unsigned_int,_spvtools::opt::Instruction_*,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_spvtools::opt::Instruction_*>_>_>,_std::default_delete<std::multimap<unsigned_int,_spvtools::opt::Instruction_*,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_spvtools::opt::Instruction_*>_>_>_>_>
                        ._M_t.
                        super__Tuple_impl<0UL,_std::multimap<unsigned_int,_spvtools::opt::Instruction_*,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_spvtools::opt::Instruction_*>_>_>_*,_std::default_delete<std::multimap<unsigned_int,_spvtools::opt::Instruction_*,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_spvtools::opt::Instruction_*>_>_>_>_>
                        .
                        super__Head_base<0UL,_std::multimap<unsigned_int,_spvtools::opt::Instruction_*,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_spvtools::opt::Instruction_*>_>_>_*,_false>
                        ._M_head_impl;
            uVar6 = (pIVar11->has_result_id_ & 1) + 1;
            if (pIVar11->has_type_id_ == false) {
              uVar6 = (uint)pIVar11->has_result_id_;
            }
            uVar6 = Instruction::GetSingleWordOperand(pIVar11,uVar6);
            local_70._8_8_ =
                 (puVar12->_M_t).
                 super___uniq_ptr_impl<spvtools::opt::Instruction,_std::default_delete<spvtools::opt::Instruction>_>
                 ._M_t.
                 super__Tuple_impl<0UL,_spvtools::opt::Instruction_*,_std::default_delete<spvtools::opt::Instruction>_>
                 .super__Head_base<0UL,_spvtools::opt::Instruction_*,_false>._M_head_impl;
            local_70._0_4_ = uVar6;
            std::
            _Rb_tree<unsigned_int,std::pair<unsigned_int_const,spvtools::opt::Instruction*>,std::_Select1st<std::pair<unsigned_int_const,spvtools::opt::Instruction*>>,std::less<unsigned_int>,std::allocator<std::pair<unsigned_int_const,spvtools::opt::Instruction*>>>
            ::_M_insert_equal<std::pair<unsigned_int_const,spvtools::opt::Instruction*>>
                      (p_Var3,(pair<const_unsigned_int,_spvtools::opt::Instruction_*> *)local_70);
          }
          if ((this->valid_analyses_ & kAnalysisBegin) != kAnalysisNone) {
            analysis::DefUseManager::AnalyzeInstDefUse
                      ((this->def_use_mgr_)._M_t.
                       super___uniq_ptr_impl<spvtools::opt::analysis::DefUseManager,_std::default_delete<spvtools::opt::analysis::DefUseManager>_>
                       ._M_t.
                       super__Tuple_impl<0UL,_spvtools::opt::analysis::DefUseManager_*,_std::default_delete<spvtools::opt::analysis::DefUseManager>_>
                       .super__Head_base<0UL,_spvtools::opt::analysis::DefUseManager_*,_false>.
                       _M_head_impl,
                       (puVar12->_M_t).
                       super___uniq_ptr_impl<spvtools::opt::Instruction,_std::default_delete<spvtools::opt::Instruction>_>
                       ._M_t.
                       super__Tuple_impl<0UL,_spvtools::opt::Instruction_*,_std::default_delete<spvtools::opt::Instruction>_>
                       .super__Head_base<0UL,_spvtools::opt::Instruction_*,_false>._M_head_impl);
          }
          pIVar11 = (puVar12->_M_t).
                    super___uniq_ptr_impl<spvtools::opt::Instruction,_std::default_delete<spvtools::opt::Instruction>_>
                    ._M_t.
                    super__Tuple_impl<0UL,_spvtools::opt::Instruction_*,_std::default_delete<spvtools::opt::Instruction>_>
                    .super__Head_base<0UL,_spvtools::opt::Instruction_*,_false>._M_head_impl;
          pMVar2 = (this->module_)._M_t.
                   super___uniq_ptr_impl<spvtools::opt::Module,_std::default_delete<spvtools::opt::Module>_>
                   ._M_t.
                   super__Tuple_impl<0UL,_spvtools::opt::Module_*,_std::default_delete<spvtools::opt::Module>_>
                   .super__Head_base<0UL,_spvtools::opt::Module_*,_false>._M_head_impl;
          (puVar12->_M_t).
          super___uniq_ptr_impl<spvtools::opt::Instruction,_std::default_delete<spvtools::opt::Instruction>_>
          ._M_t.
          super__Tuple_impl<0UL,_spvtools::opt::Instruction_*,_std::default_delete<spvtools::opt::Instruction>_>
          .super__Head_base<0UL,_spvtools::opt::Instruction_*,_false>._M_head_impl =
               (Instruction *)0x0;
          utils::IntrusiveList<spvtools::opt::Instruction>::push_back
                    (&(pMVar2->debugs2_).super_IntrusiveList<spvtools::opt::Instruction>,pIVar11);
          puVar12 = puVar12 + 1;
        } while (puVar12 != puVar5);
      }
      std::
      vector<std::unique_ptr<spvtools::opt::Instruction,_std::default_delete<spvtools::opt::Instruction>_>,_std::allocator<std::unique_ptr<spvtools::opt::Instruction,_std::default_delete<spvtools::opt::Instruction>_>_>_>
      ::~vector(&local_48);
      return;
    }
    pIVar11 = (Instruction *)_Var8._M_node[1]._M_parent;
    if (pIVar11->opcode_ == OpMemberName) {
      uVar10 = (pIVar11->has_result_id_ & 1) + 1;
      if (pIVar11->has_type_id_ == false) {
        uVar10 = (uint)pIVar11->has_result_id_;
      }
      uVar6 = Instruction::GetSingleWordOperand(pIVar11,uVar10 + 1);
      if (uVar6 < local_74) goto LAB_005a952b;
    }
    else {
LAB_005a952b:
      local_80._M_head_impl = Instruction::Clone(pIVar11,this);
      local_70._0_8_ = &PTR__SmallVector_009488e0;
      local_70._24_8_ = local_70 + 0x10;
      local_50._M_head_impl = (vector<unsigned_int,_std::allocator<unsigned_int>_> *)0x0;
      local_70._8_8_ = (Instruction *)0x1;
      uVar9 = (ulong)((local_80._M_head_impl)->has_result_id_ & 1) + 1;
      if ((local_80._M_head_impl)->has_type_id_ == false) {
        uVar9 = (ulong)(local_80._M_head_impl)->has_result_id_;
      }
      pOVar4 = ((local_80._M_head_impl)->operands_).
               super__Vector_base<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_>.
               _M_impl.super__Vector_impl_data._M_start;
      uVar7 = ((long)((local_80._M_head_impl)->operands_).
                     super__Vector_base<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_>
                     ._M_impl.super__Vector_impl_data._M_finish - (long)pOVar4 >> 4) *
              -0x5555555555555555;
      local_70._16_4_ = new_id;
      if (uVar7 < uVar9 || uVar7 - uVar9 == 0) {
        __assert_fail("index < operands_.size() && \"operand index out of bound\"",
                      "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/ThirdParty/SPIRV-Tools/source/opt/instruction.h"
                      ,0x2b8,
                      "void spvtools::opt::Instruction::SetOperand(uint32_t, Operand::OperandData &&)"
                     );
      }
      utils::SmallVector<unsigned_int,_2UL>::operator=
                ((SmallVector<unsigned_int,_2UL> *)
                 ((long)&((OperandData *)((pOVar4->words).buffer + -4))->_vptr_SmallVector +
                 (ulong)(uint)((int)uVar9 * 0x30)),(SmallVector<unsigned_int,_2UL> *)local_70);
      local_70._0_8_ = &PTR__SmallVector_009488e0;
      if (local_50._M_head_impl != (vector<unsigned_int,_std::allocator<unsigned_int>_> *)0x0) {
        std::default_delete<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>::operator()
                  ((default_delete<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_> *)
                   &local_50,local_50._M_head_impl);
      }
      std::
      vector<std::unique_ptr<spvtools::opt::Instruction,std::default_delete<spvtools::opt::Instruction>>,std::allocator<std::unique_ptr<spvtools::opt::Instruction,std::default_delete<spvtools::opt::Instruction>>>>
      ::
      emplace_back<std::unique_ptr<spvtools::opt::Instruction,std::default_delete<spvtools::opt::Instruction>>>
                ((vector<std::unique_ptr<spvtools::opt::Instruction,std::default_delete<spvtools::opt::Instruction>>,std::allocator<std::unique_ptr<spvtools::opt::Instruction,std::default_delete<spvtools::opt::Instruction>>>>
                  *)&local_48,
                 (unique_ptr<spvtools::opt::Instruction,_std::default_delete<spvtools::opt::Instruction>_>
                  *)&local_80);
      if (local_80._M_head_impl != (Instruction *)0x0) {
        (*((local_80._M_head_impl)->super_IntrusiveNodeBase<spvtools::opt::Instruction>).
          _vptr_IntrusiveNodeBase[1])();
      }
    }
    _Var8._M_node = (_Base_ptr)std::_Rb_tree_increment(_Var8._M_node);
    puVar12 = local_48.
              super__Vector_base<std::unique_ptr<spvtools::opt::Instruction,_std::default_delete<spvtools::opt::Instruction>_>,_std::allocator<std::unique_ptr<spvtools::opt::Instruction,_std::default_delete<spvtools::opt::Instruction>_>_>_>
              ._M_impl.super__Vector_impl_data._M_start;
    puVar5 = local_48.
             super__Vector_base<std::unique_ptr<spvtools::opt::Instruction,_std::default_delete<spvtools::opt::Instruction>_>,_std::allocator<std::unique_ptr<spvtools::opt::Instruction,_std::default_delete<spvtools::opt::Instruction>_>_>_>
             ._M_impl.super__Vector_impl_data._M_finish;
  } while( true );
}

Assistant:

void IRContext::CloneNames(const uint32_t old_id, const uint32_t new_id,
                           const uint32_t max_member_index) {
  std::vector<std::unique_ptr<Instruction>> names_to_add;
  auto names = GetNames(old_id);
  for (auto n : names) {
    Instruction* old_name_inst = n.second;
    if (old_name_inst->opcode() == spv::Op::OpMemberName) {
      auto midx = old_name_inst->GetSingleWordInOperand(1);
      if (midx >= max_member_index) continue;
    }
    std::unique_ptr<Instruction> new_name_inst(old_name_inst->Clone(this));
    new_name_inst->SetInOperand(0, {new_id});
    names_to_add.push_back(std::move(new_name_inst));
  }
  // We can't add the new names when we are iterating over name range above.
  // We can add all the new names now.
  for (auto& new_name : names_to_add) AddDebug2Inst(std::move(new_name));
}